

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

_Bool cf_h2_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  _Bool _Var1;
  void *local_38;
  stream_ctx *stream;
  cf_h2_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
    local_38 = (void *)0x0;
  }
  else {
    local_38 = (((data->req).p.rtsp)->http_wrapper).h2_ctx;
  }
  if ((cf->ctx == (void *)0x0) ||
     (((_Var1 = Curl_bufq_is_empty((bufq *)((long)cf->ctx + 0x18)), _Var1 &&
       ((local_38 == (void *)0x0 ||
        (_Var1 = Curl_bufq_is_empty((bufq *)((long)local_38 + 0x48)), _Var1)))) &&
      ((local_38 == (void *)0x0 || (_Var1 = Curl_bufq_is_empty((bufq *)((long)local_38 + 8)), _Var1)
       ))))) {
    if (cf->next == (Curl_cfilter *)0x0) {
      _Var1 = false;
    }
    else {
      _Var1 = (*cf->next->cft->has_data_pending)(cf->next,data);
    }
    cf_local._7_1_ = _Var1 != false;
  }
  else {
    cf_local._7_1_ = true;
  }
  return cf_local._7_1_;
}

Assistant:

static bool cf_h2_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);

  if(ctx && (!Curl_bufq_is_empty(&ctx->inbufq)
            || (stream && !Curl_bufq_is_empty(&stream->sendbuf))
            || (stream && !Curl_bufq_is_empty(&stream->recvbuf))))
    return TRUE;
  return cf->next? cf->next->cft->has_data_pending(cf->next, data) : FALSE;
}